

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::write_decimal<__int128>
          (basic_writer<fmt::v6::buffer_range<char>_> *this,__int128 value)

{
  buffer<char> *pbVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  int iVar4;
  byte bVar5;
  size_t __n;
  long lVar6;
  ulong in_RDX;
  ulong uVar7;
  ulong uVar8;
  ulong in_RSI;
  int iVar9;
  char *__dest;
  ulong uVar10;
  undefined1 *puVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 local_88 [88];
  
  uVar7 = in_RDX;
  if ((long)in_RDX < 0) {
    bVar12 = in_RSI != 0;
    in_RSI = -in_RSI;
    uVar7 = -(ulong)bVar12 - in_RDX;
  }
  auVar3._8_8_ = uVar7;
  auVar3._0_8_ = in_RSI;
  iVar9 = 1;
  if ((in_RSI < 10) <= uVar7) {
    iVar4 = 4;
    auVar13 = auVar3;
    do {
      iVar9 = iVar4;
      uVar8 = auVar13._8_8_;
      uVar10 = auVar13._0_8_;
      if (uVar8 == 0 && (ulong)(99 < uVar10) <= -uVar8) {
        iVar9 = iVar9 + -2;
        goto LAB_0012f7ed;
      }
      if (uVar8 == 0 && (ulong)(999 < uVar10) <= -uVar8) {
        iVar9 = iVar9 + -1;
        goto LAB_0012f7ed;
      }
      if (uVar8 < (uVar10 < 10000)) goto LAB_0012f7ed;
      auVar13 = __udivti3(uVar10,uVar8,10000,0);
      iVar4 = iVar9 + 4;
    } while (uVar8 != 0 || -uVar8 < (ulong)(99999 < uVar10));
    iVar9 = iVar9 + 1;
  }
LAB_0012f7ed:
  __n = (size_t)iVar9;
  pbVar1 = (this->out_).container;
  sVar2 = pbVar1->size_;
  uVar8 = (__n - ((long)in_RDX >> 0x3f)) + sVar2;
  if (pbVar1->capacity_ < uVar8) {
    (**pbVar1->_vptr_buffer)(pbVar1,uVar8);
  }
  __dest = pbVar1->ptr_ + sVar2;
  pbVar1->size_ = uVar8;
  if ((long)in_RDX < 0) {
    *__dest = '-';
    __dest = __dest + 1;
  }
  puVar11 = local_88 + __n;
  auVar13 = auVar3;
  if ((in_RSI < 100) <= uVar7) {
    do {
      lVar6 = auVar3._8_8_;
      uVar7 = auVar3._0_8_;
      auVar13 = __udivti3(uVar7,lVar6,100,0);
      uVar8 = (ulong)(uint)(auVar3._0_4_ + auVar13._0_4_ * -100);
      puVar11[-1] = basic_data<void>::digits[(uVar8 * 2 & 0xffffffff) + 1];
      puVar11[-2] = basic_data<void>::digits[uVar8 * 2];
      puVar11 = puVar11 + -2;
      auVar3 = auVar13;
    } while (lVar6 != 0 || (ulong)-lVar6 < (ulong)(9999 < uVar7));
  }
  if (auVar13._8_8_ == 0 && (ulong)(9 < auVar13._0_8_) <= (ulong)-auVar13._8_8_) {
    bVar5 = auVar13[0] | 0x30;
    lVar6 = -1;
  }
  else {
    uVar7 = auVar13._0_8_ * 2;
    puVar11[-1] = basic_data<void>::digits[(uVar7 & 0xffffffff) + 1];
    bVar5 = basic_data<void>::digits[uVar7 & 0x1fffffffe];
    lVar6 = -2;
  }
  puVar11[lVar6] = bVar5;
  memcpy(__dest,local_88,__n);
  return;
}

Assistant:

void write_decimal(Int value) {
    auto abs_value = static_cast<uint32_or_64_or_128_t<Int>>(value);
    bool negative = is_negative(value);
    // Don't do -abs_value since it trips unsigned-integer-overflow sanitizer.
    if (negative) abs_value = ~abs_value + 1;
    int num_digits = count_digits(abs_value);
    auto&& it = reserve((negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (negative) *it++ = static_cast<char_type>('-');
    it = format_decimal<char_type>(it, abs_value, num_digits);
  }